

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void * nk_create_panel(nk_context *ctx)

{
  void *in_RDI;
  nk_page_element *elem;
  nk_context *in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  local_8 = nk_create_page_element(in_stack_ffffffffffffffe8);
  if (local_8 == (nk_page_element *)0x0) {
    local_8 = (nk_page_element *)0x0;
  }
  else {
    nk_zero(in_RDI,(nk_size)local_8);
  }
  return local_8;
}

Assistant:

NK_INTERN void*
nk_create_panel(struct nk_context *ctx)
{
    struct nk_page_element *elem;
    elem = nk_create_page_element(ctx);
    if (!elem) return 0;
    nk_zero_struct(*elem);
    return &elem->data.pan;
}